

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

Char * Diligent::GetShaderVariableTypeLiteralName
                 (SHADER_RESOURCE_VARIABLE_TYPE VarType,bool bGetFullName)

{
  Char *pCVar1;
  VarTypeToLiteralNameMap *pVVar2;
  string msg;
  string local_30;
  
  if (GetShaderVariableTypeLiteralName(Diligent::SHADER_RESOURCE_VARIABLE_TYPE,bool)::
      VarTypeToLiteralName == '\0') {
    GetShaderVariableTypeLiteralName();
  }
  if (VarType < SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES) {
    pVVar2 = &GetShaderVariableTypeLiteralName::VarTypeToLiteralName;
    if (bGetFullName) {
      pVVar2 = (VarTypeToLiteralNameMap *)0x9a1c28;
    }
    pCVar1 = (pVVar2->ShortVarTypeNameStrings)._M_elems[VarType];
  }
  else {
    FormatString<char[29]>(&local_30,(char (*) [29])"Unknown shader variable type");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pCVar1 = "unknown";
  }
  return pCVar1;
}

Assistant:

const Char* GetShaderVariableTypeLiteralName(SHADER_RESOURCE_VARIABLE_TYPE VarType, bool bGetFullName)
{
    struct VarTypeToLiteralNameMap
    {
        VarTypeToLiteralNameMap()
        {
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_STATIC]  = "static";
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE] = "mutable";
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC] = "dynamic";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_STATIC]   = "SHADER_RESOURCE_VARIABLE_TYPE_STATIC";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE]  = "SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC]  = "SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC";

            static_assert(SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES == 3, "Not all shader variable types initialized.");
        }

        const Char* Get(SHADER_RESOURCE_VARIABLE_TYPE VarType, bool bGetFullName) const
        {
            if (VarType >= SHADER_RESOURCE_VARIABLE_TYPE_STATIC && VarType < SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES)
                return (bGetFullName ? FullVarTypeNameStrings : ShortVarTypeNameStrings)[VarType];
            else
            {
                UNEXPECTED("Unknown shader variable type");
                return "unknown";
            }
        }

    private:
        std::array<const Char*, SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES> ShortVarTypeNameStrings{};
        std::array<const Char*, SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES> FullVarTypeNameStrings{};
    };

    static const VarTypeToLiteralNameMap VarTypeToLiteralName;
    return VarTypeToLiteralName.Get(VarType, bGetFullName);
}